

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

void lws_vhost_destroy1(lws_vhost *vh)

{
  lws_context *plVar1;
  lws *plVar2;
  char *__s2;
  int iVar3;
  lws_vhost *vh_00;
  
  plVar1 = vh->context;
  _lws_log(8,"%s\n","lws_vhost_destroy1");
  if (((vh->field_0x2b4 & 4) == 0) && (plVar2 = vh->lserv_wsi, plVar2 != (lws *)0x0)) {
    for (vh_00 = plVar1->vhost_list; vh_00 != (lws_vhost *)0x0; vh_00 = vh_00->vhost_next) {
      if (((vh_00 != vh) && ((vh_00->field_0x2b4 & 4) == 0)) &&
         (vh_00->listen_port == vh->listen_port)) {
        __s2 = vh->iface;
        if (vh_00->iface == (char *)0x0) {
          if (__s2 == (char *)0x0) goto LAB_00112657;
        }
        else if ((__s2 != (char *)0x0) && (iVar3 = strcmp(vh_00->iface,__s2), iVar3 == 0)) {
LAB_00112657:
          if (vh_00->lserv_wsi != (lws *)0x0) {
            __assert_fail("v->lserv_wsi == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/vhost.c"
                          ,0x3fb,"void lws_vhost_destroy1(struct lws_vhost *)");
          }
          vh_00->lserv_wsi = plVar2;
          _lws_log(4,"%s: listen skt from %s to %s\n","lws_vhost_destroy1",vh->name,vh_00->name);
          if (vh_00->lserv_wsi == (lws *)0x0) {
            return;
          }
          lws_vhost_unbind_wsi(vh->lserv_wsi);
          lws_vhost_bind_wsi(vh_00,vh_00->lserv_wsi);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
lws_vhost_destroy1(struct lws_vhost *vh)
{
	struct lws_context *context = vh->context;

	lwsl_info("%s\n", __func__);

	lws_context_lock(context, "vhost destroy 1"); /* ---------- context { */

	if (vh->being_destroyed)
		goto out;

	lws_vhost_lock(vh); /* -------------- vh { */

#if defined(LWS_WITH_NETWORK)
	/*
	 * PHASE 1: take down or reassign any listen wsi
	 *
	 * Are there other vhosts that are piggybacking on our listen socket?
	 * If so we need to hand the listen socket off to one of the others
	 * so it will remain open.
	 *
	 * If not, leave it attached to the closing vhost, the vh being marked
	 * being_destroyed will defeat any service and it will get closed in
	 * later phases.
	 */

	if (vh->lserv_wsi)
		lws_start_foreach_ll(struct lws_vhost *, v,
				     context->vhost_list) {
			if (v != vh &&
			    !v->being_destroyed &&
			    v->listen_port == vh->listen_port &&
			    ((!v->iface && !vh->iface) ||
			    (v->iface && vh->iface &&
			    !strcmp(v->iface, vh->iface)))) {
				/*
				 * this can only be a listen wsi, which is
				 * restricted... it has no protocol or other
				 * bindings or states.  So we can simply
				 * swap it to a vhost that has the same
				 * iface + port, but is not closing.
				 */
				assert(v->lserv_wsi == NULL);
				v->lserv_wsi = vh->lserv_wsi;

				lwsl_notice("%s: listen skt from %s to %s\n",
					    __func__, vh->name, v->name);

				if (v->lserv_wsi) {
					lws_vhost_unbind_wsi(vh->lserv_wsi);
					lws_vhost_bind_wsi(v, v->lserv_wsi);
				}

				break;
			}
		} lws_end_foreach_ll(v, vhost_next);

#endif

	lws_vhost_unlock(vh); /* } vh -------------- */

	/*
	 * lws_check_deferred_free() will notice there is a vhost that is
	 * marked for destruction during the next 1s, for all tsi.
	 *
	 * It will start closing all wsi on this vhost.  When the last wsi
	 * is closed, it will trigger lws_vhost_destroy2()
	 */

out:
	lws_context_unlock(context); /* --------------------------- context { */
}